

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O2

void png_print_info(png_t *png)

{
  char *pcVar1;
  
  __printf_chk(1,"PNG INFO:\n");
  __printf_chk(1,"\twidth:\t\t%d\n",png->width);
  __printf_chk(1,"\theight:\t\t%d\n",png->height);
  __printf_chk(1,"\tdepth:\t\t%d\n",png->depth);
  __printf_chk(1,"\tcolor:\t\t");
  if ((ulong)png->color_type < 7) {
    pcVar1 = &DAT_001d10d0 + *(int *)(&DAT_001d10d0 + (ulong)png->color_type * 4);
  }
  else {
    pcVar1 = "unknown, this is not good\n";
  }
  __printf_chk(1,pcVar1);
  pcVar1 = "inflate/deflate";
  if (png->compression_method != '\0') {
    pcVar1 = "unknown, this is not good";
  }
  __printf_chk(1,"\tcompression:\t%s\n",pcVar1);
  pcVar1 = "adaptive";
  if (png->filter_method != '\0') {
    pcVar1 = "unknown, this is not good";
  }
  __printf_chk(1,"\tfilter:\t\t%s\n",pcVar1);
  pcVar1 = "interlace";
  if (png->interlace_method == '\0') {
    pcVar1 = "no interlace";
  }
  __printf_chk(1,"\tinterlace:\t%s\n",pcVar1);
  return;
}

Assistant:

void png_print_info(png_t* png)
{
	printf("PNG INFO:\n");
	printf("\twidth:\t\t%d\n", png->width);
	printf("\theight:\t\t%d\n", png->height);
	printf("\tdepth:\t\t%d\n", png->depth);
	printf("\tcolor:\t\t");

	switch(png->color_type)
	{
	case PNG_GREYSCALE:			printf("greyscale\n"); break;
	case PNG_TRUECOLOR:			printf("truecolor\n"); break;
	case PNG_INDEXED:			printf("palette\n"); break;
	case PNG_GREYSCALE_ALPHA:	printf("greyscale with alpha\n"); break;
	case PNG_TRUECOLOR_ALPHA:	printf("truecolor with alpha\n"); break;
	default:					printf("unknown, this is not good\n"); break;
	}

	printf("\tcompression:\t%s\n",	png->compression_method?"unknown, this is not good":"inflate/deflate");
	printf("\tfilter:\t\t%s\n",		png->filter_method?"unknown, this is not good":"adaptive");
	printf("\tinterlace:\t%s\n",	png->interlace_method?"interlace":"no interlace");
}